

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormat::setFormatWidth(DecimalFormat *this,int32_t width)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->formatWidth != width) {
    pDVar1->formatWidth = width;
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setFormatWidth(int32_t width) {
    if (width == fields->properties->formatWidth) { return; }
    fields->properties->formatWidth = width;
    touchNoError();
}